

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void Assimp::FBX::ResolveVertexDataArray<aiVector2t<float>>
               (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *data_out,
               Scope *source,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  pointer pcVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  pointer paVar4;
  undefined8 uVar5;
  Scope *pSVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  Element *pEVar11;
  long lVar12;
  pointer piVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> tempData;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator<char> local_229;
  string local_228;
  Scope *local_200;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_1f8;
  vector<int,_std::allocator<int>_> local_1d8;
  char *local_1c0;
  char *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = source;
  local_1b8 = dataElementName;
  iVar9 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1b0 = ReferenceInformationType;
  iVar10 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  bVar8 = true;
  bVar16 = true;
  if (iVar10 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,indexDataElementName,(allocator<char> *)&local_228);
    bVar8 = HasElement(local_200,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar16 = !bVar8;
  }
  bVar19 = iVar9 != 0 & bVar8;
  local_1c0 = indexDataElementName;
  iVar9 = std::__cxx11::string::compare((char *)MappingInformationType);
  pcVar7 = local_1b8;
  if ((bVar19 == 0) && (iVar9 == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,local_1b8,(allocator<char> *)&local_228);
    pSVar6 = local_200;
    bVar16 = HasElement(local_200,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar16) {
      return;
    }
    local_228._M_dataplus._M_p = (pointer)0x0;
    local_228._M_string_length = 0;
    local_228.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,pcVar7,(allocator<char> *)&local_1f8);
    pEVar11 = GetRequiredElement(pSVar6,(string *)local_1a8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_228,pEVar11)
    ;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
              (data_out,vertex_count);
    _Var3._M_p = local_228._M_dataplus._M_p;
    uVar5 = local_228.field_2._M_allocated_capacity;
    if (local_228._M_string_length - (long)local_228._M_dataplus._M_p != 0) {
      lVar12 = (long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 3;
      lVar14 = 0;
      do {
        uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar14];
        uVar15 = (ulong)uVar2;
        uVar17 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar14] + uVar2;
        if (uVar2 < uVar17) {
          do {
            (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start
            [(mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar15]] =
                 *(aiVector2t<float> *)(local_228._M_dataplus._M_p + lVar14 * 8);
            uVar15 = uVar15 + 1;
          } while (uVar17 != uVar15);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar12 + (ulong)(lVar12 == 0));
    }
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)MappingInformationType);
    if ((bool)(iVar9 != 0 | bVar16)) {
      iVar9 = std::__cxx11::string::compare((char *)MappingInformationType);
      if (bVar19 == 0 && iVar9 == 0) {
        local_228._M_dataplus._M_p = (pointer)0x0;
        local_228._M_string_length = 0;
        local_228.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,local_1b8,(allocator<char> *)&local_1f8);
        pEVar11 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_228,
                   pEVar11);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 3 ==
            vertex_count) {
          _Var3._M_p = (pointer)(data_out->
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_dataplus._M_p;
          paVar4 = (data_out->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar5 = (data_out->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._M_string_length;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_228.field_2._M_allocated_capacity;
          local_228._M_dataplus._M_p = _Var3._M_p;
          local_228._M_string_length = (size_type)paVar4;
          local_228.field_2._M_allocated_capacity = uVar5;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          _Var3._M_p = local_228._M_dataplus._M_p;
          uVar5 = local_228.field_2._M_allocated_capacity;
        }
        goto joined_r0x005f524c;
      }
      iVar9 = std::__cxx11::string::compare((char *)MappingInformationType);
      if ((bool)(bVar16 | iVar9 != 0)) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(MappingInformationType->_M_dataplus)._M_p,
                   MappingInformationType->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(local_1b0->_M_dataplus)._M_p,local_1b0->_M_string_length);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return;
      }
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1b8,(allocator<char> *)&local_228);
      pSVar6 = local_200;
      pEVar11 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
      pcVar7 = local_1c0;
      ParseVectorDataArray(&local_1f8,pEVar11);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                (data_out,vertex_count);
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar7,(allocator<char> *)&local_228);
      pEVar11 = GetRequiredElement(pSVar6,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1d8,pEVar11);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == vertex_count) {
        if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar15 = 0;
          piVar13 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar18 = (ulong)*piVar13;
            if (uVar18 == 0xffffffffffffffff) {
              paVar4 = (data_out->
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar15;
              paVar4->x = 0.0;
              paVar4->y = 0.0;
            }
            else {
              if ((ulong)((long)local_1f8.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1f8.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar18) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_228,local_1c0,&local_229);
                pEVar11 = GetRequiredElement(local_200,&local_228,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar11);
              }
              (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start[uVar15] =
                   local_1f8.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar18];
            }
            uVar15 = (ulong)((int)uVar15 + 1);
            piVar13 = piVar13 + 1;
          } while (piVar13 !=
                   local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x5f5531);
      }
    }
    else {
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1b8,(allocator<char> *)&local_228);
      pSVar6 = local_200;
      pEVar11 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1f8,pEVar11);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                (data_out,vertex_count);
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1c0,(allocator<char> *)&local_228);
      pEVar11 = GetRequiredElement(pSVar6,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1d8,pEVar11);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar12 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar14 = 0;
        do {
          uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                  ._M_impl.super__Vector_impl_data._M_start[lVar14];
          uVar15 = (ulong)uVar2;
          uVar17 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar14] + uVar2;
          if (uVar2 < uVar17) {
            do {
              if ((ulong)((long)local_1f8.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1f8.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) <=
                  (ulong)(long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar14]) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_228,local_1c0,&local_229);
                pEVar11 = GetRequiredElement(local_200,&local_228,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar11);
              }
              (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start
              [(mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar15]] =
                   local_1f8.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar14]];
              uVar15 = uVar15 + 1;
            } while (uVar17 != uVar15);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != lVar12 + (ulong)(lVar12 == 0));
      }
    }
    _Var3._M_p = (pointer)local_1f8.
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var3._M_p = (pointer)local_1f8.
                            super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
joined_r0x005f524c:
  if ((pointer)_Var3._M_p != (pointer)0x0) {
    operator_delete(_Var3._M_p,uVar5 - (long)_Var3._M_p);
  }
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}